

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

string * __thiscall
t_swift_generator::promise_function_signature_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_function *tfunction)

{
  t_struct *tstruct;
  allocator local_161;
  string local_160;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  function_name_abi_cxx11_(&local_40,this,tfunction);
  std::operator+(&local_100,"func ",&local_40);
  std::operator+(&local_e0,&local_100,"(");
  tstruct = tfunction->arglist_;
  std::__cxx11::string::string((string *)&local_140,"",&local_161);
  argument_list(&local_120,this,tstruct,&local_140,false);
  std::operator+(&local_c0,&local_e0,&local_120);
  std::operator+(&local_a0,&local_c0,") throws ");
  std::operator+(&local_80,&local_a0,"-> Promise<");
  type_name_abi_cxx11_(&local_160,this,tfunction->returntype_,false,false);
  std::operator+(&local_60,&local_80,&local_160);
  std::operator+(__return_storage_ptr__,&local_60,">");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::promise_function_signature(t_function* tfunction) {
  return "func " + function_name(tfunction) + "(" + argument_list(tfunction->get_arglist(), "", false) + ") throws "
         + "-> Promise<" + type_name(tfunction->get_returntype()) + ">";
}